

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

MatrixOrder
deqp::gles31::Functional::anon_unknown_0::getMatrixOrderFromPath
          (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           *path)

{
  pointer pVVar1;
  bool bVar2;
  MatrixOrder MVar3;
  Type *pTVar4;
  uint uVar5;
  ulong uVar6;
  MatrixOrder MVar7;
  
  pVVar1 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(path->
                               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 4);
  if ((int)uVar5 < 1) {
    return MATRIXORDER_LAST;
  }
  uVar6 = (ulong)(uVar5 & 0x7fffffff);
  pTVar4 = &pVVar1->m_type;
  MVar3 = MATRIXORDER_LAST;
  do {
    if (*pTVar4 - TYPE_INTERFACEBLOCK < 2) {
      MVar7 = (((((VariablePathComponent *)(pTVar4 + -2))->m_data).block)->layout).matrixOrder;
LAB_005627e3:
      if (MVar7 != MATRIXORDER_LAST) {
        MVar3 = MVar7;
      }
      bVar2 = true;
    }
    else {
      MVar7 = MATRIXORDER_LAST;
      if (*pTVar4 == TYPE_TYPE) goto LAB_005627e3;
      bVar2 = false;
    }
    if (!bVar2) {
      return MATRIXORDER_LAST;
    }
    pTVar4 = pTVar4 + 4;
    uVar6 = uVar6 - 1;
    if (uVar6 == 0) {
      return MVar3;
    }
  } while( true );
}

Assistant:

static glu::MatrixOrder getMatrixOrderFromPath (const std::vector<VariablePathComponent>& path)
{
	glu::MatrixOrder order = glu::MATRIXORDER_LAST;

	// inherit majority
	for (int pathNdx = 0; pathNdx < (int)path.size(); ++pathNdx)
	{
		glu::MatrixOrder matOrder;

		if (path[pathNdx].isInterfaceBlock())
			matOrder = path[pathNdx].getInterfaceBlock()->layout.matrixOrder;
		else if (path[pathNdx].isDeclaration())
			matOrder = path[pathNdx].getDeclaration()->layout.matrixOrder;
		else if (path[pathNdx].isVariableType())
			matOrder = glu::MATRIXORDER_LAST;
		else
		{
			DE_ASSERT(false);
			return glu::MATRIXORDER_LAST;
		}

		if (matOrder != glu::MATRIXORDER_LAST)
			order = matOrder;
	}

	return order;
}